

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * Balloc(int k)

{
  int iVar1;
  uint len;
  Bigint *rv;
  int x;
  int k_local;
  
  iVar1 = 1 << ((byte)k & 0x1f);
  _x = (Bigint *)
       __ckd_malloc__(((long)(iVar1 + -1) * 4 + 0x27U >> 3 & 0xffffffff) << 3,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/dtoa.c"
                      ,0x1a9);
  if (_x == (Bigint *)0x0) {
    _x = (Bigint *)0x0;
  }
  else {
    _x->k = k;
    _x->maxwds = iVar1;
    _x->wds = 0;
    _x->sign = 0;
  }
  return _x;
}

Assistant:

static Bigint *
Balloc(int k)
{
    int x;
    Bigint *rv;
    unsigned int len;

    if (k <= Kmax && (rv = freelist[k]))
        freelist[k] = rv->next;
    else {
        x = 1 << k;
        len = (sizeof(Bigint) + (x-1)*sizeof(ULong) + sizeof(double) - 1)
            /sizeof(double);
        if (k <= Kmax && pmem_next - private_mem + len <= PRIVATE_mem) {
            rv = (Bigint*)pmem_next;
            pmem_next += len;
        }
        else {
            rv = (Bigint*)MALLOC(len*sizeof(double));
            if (rv == NULL)
                return NULL;
        }
        rv->k = k;
        rv->maxwds = x;
    }
    rv->sign = rv->wds = 0;
    return rv;
}